

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O0

void __thiscall icu_63::PluralRuleParser::checkSyntax(PluralRuleParser *this,UErrorCode *status)

{
  UBool UVar1;
  tokenType tVar2;
  UErrorCode *status_local;
  PluralRuleParser *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    if ((this->prevType != none) && (this->prevType != tSemiColon)) {
      tVar2 = getKeyType(&this->token,this->type);
      this->type = tVar2;
    }
    switch(this->prevType) {
    case none:
    case tSemiColon:
      if ((this->type != tKeyword) && (this->type != tEOF)) {
        *status = U_FMT_PARSE_ERROR_START;
      }
      break;
    case tNumber:
      if ((((this->type != tDot2) && (this->type != tSemiColon)) &&
          ((((this->type != tIs &&
             ((((this->type != tNot && (this->type != tIn)) && (this->type != tEqual)) &&
              ((this->type != tNotEqual && (this->type != tWithin)))))) && (this->type != tAnd)) &&
           ((this->type != tOr && (this->type != tComma)))))) &&
         ((this->type != tAt && (this->type != tEOF)))) {
        *status = U_FMT_PARSE_ERROR_START;
      }
      break;
    case tComma:
      if (this->type != tNumber) {
        *status = U_FMT_PARSE_ERROR_START;
      }
      break;
    default:
      *status = U_FMT_PARSE_ERROR_START;
      break;
    case tColon:
      if ((((this->type != tVariableN) && (this->type != tVariableI)) && (this->type != tVariableF))
         && (((this->type != tVariableT && (this->type != tVariableV)) && (this->type != tAt)))) {
        *status = U_FMT_PARSE_ERROR_START;
      }
      break;
    case tAt:
      if ((this->type != tDecimal) && (this->type != tInteger)) {
        *status = U_FMT_PARSE_ERROR_START;
      }
      break;
    case tDot2:
    case tMod:
    case tIn:
    case tEqual:
    case tNotEqual:
    case tWithin:
      if (this->type != tNumber) {
        *status = U_FMT_PARSE_ERROR_START;
      }
      break;
    case tKeyword:
      if (this->type != tColon) {
        *status = U_FMT_PARSE_ERROR_START;
      }
      break;
    case tAnd:
    case tOr:
      if (((this->type != tVariableN) && (this->type != tVariableI)) &&
         ((this->type != tVariableF && ((this->type != tVariableT && (this->type != tVariableV))))))
      {
        *status = U_FMT_PARSE_ERROR_START;
      }
      break;
    case tNot:
      if (((this->type != tNumber) && (this->type != tIn)) && (this->type != tWithin)) {
        *status = U_FMT_PARSE_ERROR_START;
      }
      break;
    case tIs:
      if ((this->type != tNumber) && (this->type != tNot)) {
        *status = U_FMT_PARSE_ERROR_START;
      }
      break;
    case tVariableN:
    case tVariableI:
    case tVariableF:
    case tVariableV:
    case tVariableT:
      if (((((this->type != tIs) && (this->type != tMod)) && (this->type != tIn)) &&
          ((this->type != tNot && (this->type != tWithin)))) &&
         ((this->type != tEqual && (this->type != tNotEqual)))) {
        *status = U_FMT_PARSE_ERROR_START;
      }
    }
  }
  return;
}

Assistant:

void
PluralRuleParser::checkSyntax(UErrorCode &status)
{
    if (U_FAILURE(status)) {
        return;
    }
    if (!(prevType==none || prevType==tSemiColon)) {
        type = getKeyType(token, type);  // Switch token type from tKeyword if we scanned a reserved word,
                                               //   and we are not at the start of a rule, where a
                                               //   keyword is expected.
    }

    switch(prevType) {
    case none:
    case tSemiColon:
        if (type!=tKeyword && type != tEOF) {
            status = U_UNEXPECTED_TOKEN;
        }
        break;
    case tVariableN:
    case tVariableI:
    case tVariableF:
    case tVariableT:
    case tVariableV:
        if (type != tIs && type != tMod && type != tIn &&
            type != tNot && type != tWithin && type != tEqual && type != tNotEqual) {
            status = U_UNEXPECTED_TOKEN;
        }
        break;
    case tKeyword:
        if (type != tColon) {
            status = U_UNEXPECTED_TOKEN;
        }
        break;
    case tColon:
        if (!(type == tVariableN ||
              type == tVariableI ||
              type == tVariableF ||
              type == tVariableT ||
              type == tVariableV ||
              type == tAt)) {
            status = U_UNEXPECTED_TOKEN;
        }
        break;
    case tIs:
        if ( type != tNumber && type != tNot) {
            status = U_UNEXPECTED_TOKEN;
        }
        break;
    case tNot:
        if (type != tNumber && type != tIn && type != tWithin) {
            status = U_UNEXPECTED_TOKEN;
        }
        break;
    case tMod:
    case tDot2:
    case tIn:
    case tWithin:
    case tEqual:
    case tNotEqual:
        if (type != tNumber) {
            status = U_UNEXPECTED_TOKEN;
        }
        break;
    case tAnd:
    case tOr:
        if ( type != tVariableN &&
             type != tVariableI &&
             type != tVariableF &&
             type != tVariableT &&
             type != tVariableV) {
            status = U_UNEXPECTED_TOKEN;
        }
        break;
    case tComma:
        if (type != tNumber) {
            status = U_UNEXPECTED_TOKEN;
        }
        break;
    case tNumber:
        if (type != tDot2  && type != tSemiColon && type != tIs       && type != tNot    &&
            type != tIn    && type != tEqual     && type != tNotEqual && type != tWithin &&
            type != tAnd   && type != tOr        && type != tComma    && type != tAt     &&
            type != tEOF)
        {
            status = U_UNEXPECTED_TOKEN;
        }
        // TODO: a comma following a number that is not part of a range will be allowed.
        //       It's not the only case of this sort of thing. Parser needs a re-write.
        break;
    case tAt:
        if (type != tDecimal && type != tInteger) {
            status = U_UNEXPECTED_TOKEN;
        }
        break;
    default:
        status = U_UNEXPECTED_TOKEN;
        break;
    }
}